

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

PLSample __thiscall
pbrt::PiecewiseLinear2D<2UL>::Sample(PiecewiseLinear2D<2UL> *this,Vector2f sample,Float *param)

{
  undefined8 uVar1;
  Tuple2<pbrt::Vector2,_float> TVar2;
  int iVar3;
  float *pfVar4;
  bool bVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  size_t sVar10;
  uint32_t uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  undefined1 in_register_00001208 [56];
  undefined1 auVar17 [64];
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  PLSample PVar21;
  uint32_t slice_size;
  float param_weight [4];
  anon_class_40_5_7795fd69 fetch_conditional;
  anon_class_24_3_1cc003bc fetch_marginal;
  uint32_t local_c4;
  Tuple2<pbrt::Vector2,_float> local_c0;
  float local_b8;
  float local_b4;
  float local_b0;
  uint32_t local_ac;
  float local_a8 [6];
  anon_class_40_5_7795fd69 local_90;
  size_t local_68;
  undefined1 local_60 [40];
  Tuple2<pbrt::Vector2,_float> *local_38;
  
  auVar17._8_56_ = in_register_00001208;
  auVar17._0_8_ = sample.super_Tuple2<pbrt::Vector2,_float>;
  auVar13._8_4_ = 0x33800000;
  auVar13._0_8_ = 0x3380000033800000;
  auVar13._12_4_ = 0x33800000;
  auVar14._8_4_ = 0x3f7fffff;
  auVar14._0_8_ = 0x3f7fffff3f7fffff;
  auVar14._12_4_ = 0x3f7fffff;
  local_60._0_8_ = (PiecewiseLinear2D<2UL> *)0x0;
  iVar9 = 0;
  uVar6 = vcmpps_avx512vl(auVar17._0_16_,auVar13,1);
  auVar13 = vminps_avx(auVar14,auVar17._0_16_);
  bVar5 = (bool)((byte)uVar6 & 1);
  auVar12._0_4_ = (uint)bVar5 * 0x33800000 | (uint)!bVar5 * auVar13._0_4_;
  bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
  auVar12._4_4_ = (uint)bVar5 * 0x33800000 | (uint)!bVar5 * auVar13._4_4_;
  bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
  auVar12._8_4_ = (uint)bVar5 * 0x33800000 | (uint)!bVar5 * auVar13._8_4_;
  bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
  auVar12._12_4_ = (uint)bVar5 * 0x33800000 | (uint)!bVar5 * auVar13._12_4_;
  local_c0 = (Tuple2<pbrt::Vector2,_float>)vmovlps_avx(auVar12);
  local_60._24_8_ = param;
  for (; (ulong)local_60._0_8_ < (PiecewiseLinear2D<2UL> *)0x2;
      local_60._0_8_ =
           (long)&(((PiecewiseLinear2D<2UL> *)local_60._0_8_)->m_size).
                  super_Tuple2<pbrt::Vector2,_int>.x + 1) {
    if ((ulong)this->m_param_size[local_60._0_8_] == 1) {
      uVar1 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
      *(undefined8 *)(local_a8 + local_60._0_8_ * 2) = uVar1;
    }
    else {
      local_90.this = this;
      local_90.offset = (uint32_t *)local_60;
      local_90.slice_size = (uint32_t *)(local_60 + 0x18);
      sVar10 = FindInterval<pbrt::PiecewiseLinear2D<2ul>::Sample(pbrt::Vector2<float>,float_const*)const::_lambda(unsigned_int)_1_>
                         ((ulong)this->m_param_size[local_60._0_8_],
                          (anon_class_24_3_14863758 *)&local_90);
      pfVar4 = (this->m_param_values).ptr[local_60._0_8_].ptr;
      fVar15 = pfVar4[sVar10 & 0xffffffff];
      auVar12 = ZEXT416((uint)((*(float *)(local_60._24_8_ + local_60._0_8_ * 4) - fVar15) /
                              (pfVar4[(int)sVar10 + 1] - fVar15)));
      auVar13 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar12);
      uVar1 = vcmpss_avx512f(auVar12,ZEXT816(0) << 0x40,1);
      fVar15 = (float)((uint)!(bool)((byte)uVar1 & 1) * auVar13._0_4_);
      local_a8[local_60._0_8_ * 2 + 1] = fVar15;
      local_a8[local_60._0_8_ * 2] = 1.0 - fVar15;
      iVar9 = (int)sVar10 * this->m_param_strides[local_60._0_8_] + iVar9;
    }
  }
  iVar3 = (this->m_size).super_Tuple2<pbrt::Vector2,_int>.y;
  local_60._16_8_ = local_a8;
  local_c4 = iVar3 * iVar9;
  local_90.this = (PiecewiseLinear2D<2UL> *)local_60;
  local_90.offset = (uint32_t *)&local_c0;
  local_60._0_8_ = this;
  local_60._8_8_ = &local_c4;
  sVar10 = FindInterval<pbrt::PiecewiseLinear2D<2ul>::Sample(pbrt::Vector2<float>,float_const*)const::_lambda(unsigned_int)_3_>
                     ((long)iVar3,(anon_class_16_2_357700c5 *)&local_90);
  fVar15 = Sample::anon_class_24_3_1cc003bc::operator()
                     ((anon_class_24_3_1cc003bc *)local_60,(uint32_t)sVar10);
  iVar3 = (this->m_size).super_Tuple2<pbrt::Vector2,_int>.x;
  uVar11 = (this->m_size).super_Tuple2<pbrt::Vector2,_int>.y * iVar3;
  local_c4 = iVar9 * uVar11 + iVar3 * (uint32_t)sVar10;
  local_ac = uVar11;
  local_68 = sVar10;
  local_c0.y = local_c0.y - fVar15;
  local_b8 = lookup<2UL,_0>(this,(this->m_conditional_cdf).ptr,iVar3 + -1 + local_c4,uVar11,local_a8
                           );
  fVar16 = lookup<2UL,_0>(this,(this->m_conditional_cdf).ptr,
                          (local_c4 - 1) + (this->m_size).super_Tuple2<pbrt::Vector2,_int>.x * 2,
                          uVar11,local_a8);
  fVar15 = local_b8 - fVar16;
  auVar7._8_4_ = 0x7fffffff;
  auVar7._0_8_ = 0x7fffffff7fffffff;
  auVar7._12_4_ = 0x7fffffff;
  auVar13 = vandps_avx512vl(ZEXT416((uint)fVar15),auVar7);
  auVar12 = ZEXT416((uint)local_b8);
  if ((local_b8 + fVar16) * 0.0001 <= auVar13._0_4_) {
    auVar19._0_12_ = ZEXT812(0);
    auVar19._12_4_ = 0;
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * local_c0.y * -2.0)),auVar12,auVar12);
    auVar13 = vmaxss_avx(auVar13,auVar19);
    auVar13 = vsqrtss_avx(auVar13,auVar13);
    local_c0.y = local_b8 - auVar13._0_4_;
  }
  else {
    local_c0.y = local_c0.y + local_c0.y;
    fVar15 = local_b8 + fVar16;
  }
  local_c0.y = local_c0.y / fVar15;
  local_90.slice_size = &local_ac;
  auVar13 = vfmadd213ss_fma(auVar12,ZEXT416((uint)(1.0 - local_c0.y)),
                            ZEXT416((uint)(fVar16 * local_c0.y)));
  local_c0.x = auVar13._0_4_ * local_c0.x;
  local_90.this = this;
  local_90.offset = &local_c4;
  local_90.param_weight = (float (*) [4])local_a8;
  local_90.sample = (Vector2f *)&local_c0;
  local_60._32_8_ = &local_90;
  local_38 = &local_c0;
  sVar10 = FindInterval<pbrt::PiecewiseLinear2D<2ul>::Sample(pbrt::Vector2<float>,float_const*)const::_lambda(unsigned_int)_5_>
                     ((long)(this->m_size).super_Tuple2<pbrt::Vector2,_int>.x,
                      (anon_class_16_2_01b6dfc0 *)(local_60 + 0x20));
  uVar11 = (uint32_t)sVar10;
  fVar15 = Sample::anon_class_40_5_7795fd69::operator()(&local_90,uVar11);
  local_c4 = local_c4 + uVar11;
  local_c0.x = local_c0.x - fVar15;
  local_b8 = lookup<2UL,_0>(this,(this->m_data).ptr,local_c4,local_ac,local_a8);
  local_b0 = lookup<2UL,_0>(this,(this->m_data).ptr + 1,local_c4,local_ac,local_a8);
  local_b4 = lookup<2UL,_0>(this,(this->m_data).ptr +
                                 (this->m_size).super_Tuple2<pbrt::Vector2,_int>.x,local_c4,local_ac
                            ,local_a8);
  fVar15 = lookup<2UL,_0>(this,(this->m_data).ptr +
                               (long)(this->m_size).super_Tuple2<pbrt::Vector2,_int>.x + 1,local_c4,
                          local_ac,local_a8);
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * local_c0.y)),ZEXT416((uint)(1.0 - local_c0.y)),
                            ZEXT416((uint)local_b0));
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(local_c0.y * local_b4)),ZEXT416((uint)(1.0 - local_c0.y))
                            ,ZEXT416((uint)local_b8));
  fVar16 = auVar12._0_4_;
  fVar18 = auVar13._0_4_;
  fVar15 = fVar16 - fVar18;
  auVar8._8_4_ = 0x7fffffff;
  auVar8._0_8_ = 0x7fffffff7fffffff;
  auVar8._12_4_ = 0x7fffffff;
  auVar13 = vandps_avx512vl(ZEXT416((uint)fVar15),auVar8);
  if ((fVar16 + fVar18) * 0.0001 <= auVar13._0_4_) {
    auVar20._0_12_ = ZEXT812(0);
    auVar20._12_4_ = 0;
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * local_c0.x * -2.0)),auVar12,auVar12);
    auVar13 = vmaxss_avx(auVar13,auVar20);
    auVar13 = vsqrtss_avx(auVar13,auVar13);
    local_c0.x = fVar16 - auVar13._0_4_;
  }
  else {
    local_c0.x = local_c0.x + local_c0.x;
    fVar15 = fVar16 + fVar18;
  }
  local_c0.x = local_c0.x / fVar15;
  auVar13 = vpinsrd_avx(ZEXT416(uVar11),(undefined4)local_68,1);
  auVar14 = vcvtudq2ps_avx512vl(auVar13);
  auVar13 = vinsertps_avx(ZEXT416((uint)local_c0.x),ZEXT416((uint)local_c0.y),0x10);
  TVar2 = (this->m_patch_size).super_Tuple2<pbrt::Vector2,_float>;
  PVar21.p.super_Tuple2<pbrt::Vector2,_float>.x = (auVar13._0_4_ + auVar14._0_4_) * TVar2.x;
  PVar21.p.super_Tuple2<pbrt::Vector2,_float>.y = (auVar13._4_4_ + auVar14._4_4_) * TVar2.y;
  auVar13 = vfmadd213ss_fma(auVar12,ZEXT416((uint)(1.0 - local_c0.x)),
                            ZEXT416((uint)(fVar18 * local_c0.x)));
  PVar21.pdf = auVar13._0_4_ *
               (this->m_inv_patch_size).super_Tuple2<pbrt::Vector2,_float>.x *
               (this->m_inv_patch_size).super_Tuple2<pbrt::Vector2,_float>.y;
  return PVar21;
}

Assistant:

PBRT_CPU_GPU
    PLSample Sample(Vector2f sample, const Float *param = nullptr) const {
        /* Avoid degeneracies at the extrema */
        sample[0] = Clamp(sample[0], 1 - OneMinusEpsilon, OneMinusEpsilon);
        sample[1] = Clamp(sample[1], 1 - OneMinusEpsilon, OneMinusEpsilon);

        /* Look up parameter-related indices and weights (if Dimension != 0) */
        float param_weight[2 * ArraySize];
        uint32_t slice_offset = 0u;
        for (size_t dim = 0; dim < Dimension; ++dim) {
            if (m_param_size[dim] == 1) {
                param_weight[2 * dim] = 1.f;
                param_weight[2 * dim + 1] = 0.f;
                continue;
            }

            uint32_t param_index = FindInterval(m_param_size[dim], [&](uint32_t idx) {
                return m_param_values[dim].data()[idx] <= param[dim];
            });

            float p0 = m_param_values[dim][param_index],
                  p1 = m_param_values[dim][param_index + 1];

            param_weight[2 * dim + 1] = Clamp((param[dim] - p0) / (p1 - p0), 0.f, 1.f);
            param_weight[2 * dim] = 1.f - param_weight[2 * dim + 1];
            slice_offset += m_param_strides[dim] * param_index;
        }

        /* Sample the row first */
        uint32_t offset = 0;
        if (Dimension != 0)
            offset = slice_offset * m_size.y;

        auto fetch_marginal = [&](uint32_t idx) -> float {
            return lookup<Dimension>(m_marginal_cdf.data(), offset + idx, m_size.y,
                                     param_weight);
        };

        uint32_t row = FindInterval(
            m_size.y, [&](uint32_t idx) { return fetch_marginal(idx) < sample.y; });

        sample.y -= fetch_marginal(row);

        uint32_t slice_size = HProd(m_size);
        offset = row * m_size.x;
        if (Dimension != 0)
            offset += slice_offset * slice_size;

        float r0 = lookup<Dimension>(m_conditional_cdf.data(), offset + m_size.x - 1,
                                     slice_size, param_weight),
              r1 =
                  lookup<Dimension>(m_conditional_cdf.data(), offset + (m_size.x * 2 - 1),
                                    slice_size, param_weight);

        bool is_const = std::abs(r0 - r1) < 1e-4f * (r0 + r1);
        sample.y = is_const ? (2.f * sample.y)
                            : (r0 - SafeSqrt(r0 * r0 - 2.f * sample.y * (r0 - r1)));
        sample.y /= is_const ? (r0 + r1) : (r0 - r1);

        /* Sample the column next */
        sample.x *= (1.f - sample.y) * r0 + sample.y * r1;

        auto fetch_conditional = [&](uint32_t idx) -> float {
            float v0 = lookup<Dimension>(m_conditional_cdf.data(), offset + idx,
                                         slice_size, param_weight),
                  v1 = lookup<Dimension>(m_conditional_cdf.data() + m_size.x,
                                         offset + idx, slice_size, param_weight);

            return (1.f - sample.y) * v0 + sample.y * v1;
        };

        uint32_t col = FindInterval(
            m_size.x, [&](uint32_t idx) { return fetch_conditional(idx) < sample.x; });

        sample.x -= fetch_conditional(col);

        offset += col;

        float v00 = lookup<Dimension>(m_data.data(), offset, slice_size, param_weight),
              v10 =
                  lookup<Dimension>(m_data.data() + 1, offset, slice_size, param_weight),
              v01 = lookup<Dimension>(m_data.data() + m_size.x, offset, slice_size,
                                      param_weight),
              v11 = lookup<Dimension>(m_data.data() + m_size.x + 1, offset, slice_size,
                                      param_weight),
              c0 = std::fma((1.f - sample.y), v00, sample.y * v01),
              c1 = std::fma((1.f - sample.y), v10, sample.y * v11);

        is_const = std::abs(c0 - c1) < 1e-4f * (c0 + c1);
        sample.x = is_const ? (2.f * sample.x)
                            : (c0 - SafeSqrt(c0 * c0 - 2.f * sample.x * (c0 - c1)));
        sample.x /= is_const ? (c0 + c1) : (c0 - c1);

        return {Vector2f((col + sample.x) * m_patch_size.x,
                         (row + sample.y) * m_patch_size.y),
                ((1.f - sample.x) * c0 + sample.x * c1) * HProd(m_inv_patch_size)};
    }